

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_complexity_per_elem_tmpl<3,3>(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  LO LVar1;
  Int ent_dim;
  void *extraout_RDX;
  Reals RVar2;
  Write<double> local_f8;
  undefined1 local_e8 [8];
  type f;
  undefined1 local_98 [8];
  Reals elem_metrics;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> out_w;
  undefined1 local_40 [8];
  Reals coords;
  LOs elems2verts;
  Reals *v2m_local;
  Mesh *mesh_local;
  
  Mesh::ask_elem_verts((Mesh *)&coords.write_.shared_alloc_.direct_ptr);
  Mesh::coords((Mesh *)local_40);
  LVar1 = Mesh::nelems(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"",(allocator *)((long)&elem_metrics.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_60,LVar1,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&elem_metrics.write_.shared_alloc_.direct_ptr + 7));
  ent_dim = Mesh::dim(mesh);
  Read<double>::Read((Read<double> *)&f.out_w.shared_alloc_.direct_ptr,v2m);
  get_mident_metrics((Omega_h *)local_98,mesh,ent_dim,(Reals *)&f.out_w.shared_alloc_.direct_ptr,
                     false);
  Read<double>::~Read((Read<double> *)&f.out_w.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)local_e8,(Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.elems2verts.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_40);
  Read<double>::Read((Read<double> *)&f.coords.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_98);
  Write<double>::Write
            ((Write<double> *)&f.elem_metrics.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_60);
  LVar1 = Mesh::nelems(mesh);
  parallel_for<Omega_h::get_complexity_per_elem_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<double>)::_lambda(int)_1_>
            (LVar1,(type *)local_e8);
  Write<double>::Write(&local_f8,(Write<double> *)local_60);
  Read<double>::Read((Read<double> *)this,&local_f8);
  Write<double>::~Write(&local_f8);
  get_complexity_per_elem_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<double>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)local_e8);
  Read<double>::~Read((Read<double> *)local_98);
  Write<double>::~Write((Write<double> *)local_60);
  Read<double>::~Read((Read<double> *)local_40);
  Read<int>::~Read((Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_complexity_per_elem_tmpl(Mesh* mesh, Reals v2m) {
  auto const elems2verts = mesh->ask_elem_verts();
  auto const coords = mesh->coords();
  auto const out_w = Write<Real>(mesh->nelems());
  auto const elem_metrics = get_mident_metrics(mesh, mesh->dim(), v2m);
  auto f = OMEGA_H_LAMBDA(LO const e) {
    auto const v = gather_verts<mesh_dim + 1>(elems2verts, e);
    auto const p = gather_vectors<mesh_dim + 1, mesh_dim>(coords, v);
    auto const b = simplex_basis<mesh_dim, mesh_dim>(p);
    auto const real_volume = simplex_size_from_basis(b);
    auto const m = get_symm<metric_dim>(elem_metrics, e);
    auto const sqrt_metric_det =
        power<mesh_dim, 2 * metric_dim>(determinant(m));
    out_w[e] = real_volume * sqrt_metric_det;
  };
  parallel_for(mesh->nelems(), std::move(f));
  return Reals(out_w);
}